

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.cpp
# Opt level: O3

void __thiscall boozd::azzio::io_context::run(io_context *this)

{
  vector<int,std::allocator<int>> *this_00;
  long *plVar1;
  iterator __position;
  stream *psVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  _Storage<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true>
  *in_RSI;
  _Storage<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true>
  *this_01;
  optional<int> read;
  _Storage<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true>
  local_38;
  
  if (((this->_pack_optional).
       super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
       ._M_payload.
       super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
       ._M_engaged == true) &&
     ((this->_handler_optional).
      super__Optional_base<std::function<void_(boozd::azzio::io_context::error_code)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<void_(boozd::azzio::io_context::error_code)>,_true,_false,_false>
      .super__Optional_payload_base<std::function<void_(boozd::azzio::io_context::error_code)>_>.
      _M_engaged == true)) {
    this_00 = *(vector<int,std::allocator<int>> **)
               &(this->_pack_optional).
                super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
                ._M_payload.
                super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
                ._M_payload;
    plVar1 = *(long **)((long)&(this->_pack_optional).
                               super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
                               ._M_payload.
                               super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
                               ._M_payload + 8);
    this_01 = (_Storage<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true>
               *)this;
    lVar4 = std::chrono::_V2::steady_clock::now();
    lVar5 = std::chrono::_V2::steady_clock::now();
    for (lVar5 = lVar5 - lVar4; lVar5 < 1000000000; lVar5 = lVar5 - lVar4) {
      local_38._M_value.
      super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>.
      super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>.
      super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false>._M_head_impl =
           (_Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>)
           (**(code **)(*plVar1 + 0x10))(plVar1);
      if (((ulong)local_38._M_value.
                  super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>
                  .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>.
                  super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false>.
                  _M_head_impl >> 0x20 & 1) != 0) {
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    (this_00,__position,(int *)&local_38);
        }
        else {
          *__position._M_current = local_38._0_4_;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
      }
      local_38._M_value.
      super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>.
      super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>.
      super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false>._M_head_impl =
           (_Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>)
           (_Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false>)0x0;
      local_38._M_value.
      super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>.
      super__Head_base<0UL,_boozd::azzio::stream_&,_false>._M_head_impl =
           (_Head_base<0UL,_boozd::azzio::stream_&,_false>)(stream *)0x5f5e100;
      do {
        in_RSI = &local_38;
        this_01 = &local_38;
        iVar3 = nanosleep((timespec *)&local_38._M_value,(timespec *)&local_38._M_value);
        if (iVar3 != -1) break;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      lVar5 = std::chrono::_V2::steady_clock::now();
    }
    local_38._M_value.
    super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>.
    super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>.
    super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false>._M_head_impl =
         (_Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>)
         ((ulong)local_38._M_value.
                 super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>
                 .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>.
                 super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false>._M_head_impl
         & 0xffffffff00000000);
    if (*(long *)((long)&(this->_handler_optional).
                         super__Optional_base<std::function<void_(boozd::azzio::io_context::error_code)>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::function<void_(boozd::azzio::io_context::error_code)>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::function<void_(boozd::azzio::io_context::error_code)>_>
                         ._M_payload + 0x10) == 0) {
      std::__throw_bad_function_call();
      std::_Optional_payload_base<std::function<void_(boozd::azzio::io_context::error_code)>_>::
      _M_reset((_Optional_payload_base<std::function<void_(boozd::azzio::io_context::error_code)>_>
                *)&this_01->_M_value);
      (((pack_optional *)
       &(this_01->_M_value).
        super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>)->
      super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
      )._M_payload.
      super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
      ._M_payload._M_value.
      super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>.
      super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&> =
           (_Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false>)0x0;
      (((pack_optional *)
       &(this_01->_M_value).
        super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>)->
      super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
      )._M_payload.
      super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
      ._M_payload._M_value.
      super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>.
      super__Head_base<0UL,_boozd::azzio::stream_&,_false>._M_head_impl = (stream *)0x0;
      *(undefined8 *)
       &(((pack_optional *)
         &(this_01->_M_value).
          super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>)
        ->
        super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
        )._M_payload.
        super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
        ._M_engaged = 0;
      *(undefined8 *)
       &(((io_context *)this_01)->_handler_optional).
        super__Optional_base<std::function<void_(boozd::azzio::io_context::error_code)>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::function<void_(boozd::azzio::io_context::error_code)>,_true,_false,_false>
        .super__Optional_payload_base<std::function<void_(boozd::azzio::io_context::error_code)>_>.
        _M_payload = *(undefined8 *)((long)in_RSI + 0x18);
      if (*(long *)((long)in_RSI + 0x10) != 0) {
        psVar2 = *(stream **)((long)&in_RSI->_M_value + 8);
        (((pack_optional *)
         &(this_01->_M_value).
          super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>)
        ->
        super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
        )._M_payload.
        super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
        ._M_payload._M_value.
        super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>.
        super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&> =
             (_Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>)
             *(undefined8 *)&in_RSI->_M_value;
        (((pack_optional *)
         &(this_01->_M_value).
          super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>)
        ->
        super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
        )._M_payload.
        super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
        ._M_payload._M_value.
        super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>.
        super__Head_base<0UL,_boozd::azzio::stream_&,_false>._M_head_impl = psVar2;
        *(undefined8 *)
         &(((pack_optional *)
           &(this_01->_M_value).
            super__Tuple_impl<0UL,_boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>
           )->
          super__Optional_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>,_true,_false>
          )._M_payload.
          super__Optional_payload_base<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>
          ._M_engaged = *(undefined8 *)((long)in_RSI + 0x10);
        *(undefined8 *)((long)in_RSI + 0x10) = 0;
        *(undefined8 *)((long)in_RSI + 0x18) = 0;
      }
      *(undefined1 *)
       ((long)&(((io_context *)this_01)->_handler_optional).
               super__Optional_base<std::function<void_(boozd::azzio::io_context::error_code)>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::function<void_(boozd::azzio::io_context::error_code)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<void_(boozd::azzio::io_context::error_code)>_>
               ._M_payload + 8) = 1;
      return;
    }
    (*(this->_handler_optional).
      super__Optional_base<std::function<void_(boozd::azzio::io_context::error_code)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<void_(boozd::azzio::io_context::error_code)>,_true,_false,_false>
      .super__Optional_payload_base<std::function<void_(boozd::azzio::io_context::error_code)>_>.
      _M_payload._M_value._M_invoker)((_Any_data *)&this->_handler_optional,(error_code *)&local_38)
    ;
  }
  return;
}

Assistant:

void io_context::run()
{
    if (_pack_optional && _handler_optional) {
        auto& [s, b] = *_pack_optional;
        using namespace std::chrono;
        auto start = steady_clock::now();
        while (duration_cast<milliseconds>(steady_clock::now() - start).count() < 1000) {
            if (auto read = s.read())
                b.emplace_back(*read);
            std::this_thread::sleep_for(milliseconds(100));
        }

        (*_handler_optional)(error_code::no_error);
    }
}